

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int fts5SeekCursor(Fts5Cursor *pCsr,int bErrormsg)

{
  Fts5Config *pFVar1;
  int iVar2;
  i64 iVar3;
  char *pcVar4;
  Fts5Cursor *in_RDI;
  Fts5Table *pTab_1;
  int eStmt;
  Fts5FullTable *pTab;
  int rc;
  Fts5Cursor *in_stack_ffffffffffffff98;
  sqlite3_stmt **in_stack_ffffffffffffffa0;
  Fts5FullTable *p;
  sqlite3 *in_stack_ffffffffffffffa8;
  Fts5FullTable *p_00;
  Fts5Storage *in_stack_ffffffffffffffb0;
  sqlite3_stmt *pStmt;
  undefined4 in_stack_ffffffffffffffc8;
  int in_stack_ffffffffffffffcc;
  int local_10;
  
  local_10 = 0;
  if (in_RDI->pStmt == (sqlite3_stmt *)0x0) {
    in_stack_ffffffffffffffcc = fts5StmtType(in_RDI);
    local_10 = sqlite3Fts5StorageStmt
                         (in_stack_ffffffffffffffb0,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                          in_stack_ffffffffffffffa0,(char **)in_stack_ffffffffffffff98);
  }
  if ((local_10 == 0) && ((in_RDI->csrflags & 2U) != 0)) {
    p = (Fts5FullTable *)(in_RDI->base).pVtab;
    sqlite3_reset((sqlite3_stmt *)in_stack_ffffffffffffffb0);
    pStmt = in_RDI->pStmt;
    fts5CursorRowid(in_stack_ffffffffffffff98);
    sqlite3_bind_int64(pStmt,(int)((ulong)in_stack_ffffffffffffffa8 >> 0x20),
                       (sqlite_int64)in_stack_ffffffffffffffa0);
    pFVar1 = (p->p).pConfig;
    pFVar1->bLock = pFVar1->bLock + 1;
    iVar2 = sqlite3_step((sqlite3_stmt *)
                         CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
    pFVar1 = (p->p).pConfig;
    pFVar1->bLock = pFVar1->bLock + -1;
    if (iVar2 == 100) {
      local_10 = 0;
      in_RDI->csrflags = in_RDI->csrflags & 0xfffffffd;
    }
    else {
      local_10 = sqlite3_reset(pStmt);
      if (local_10 == 0) {
        local_10 = 0x10b;
        p_00 = p;
        iVar3 = fts5CursorRowid(in_stack_ffffffffffffff98);
        fts5SetVtabError(p_00,"fts5: missing row %lld from content table %s",iVar3,
                         ((p->p).pConfig)->zContent);
      }
      else if (((p->p).pConfig)->pzErrmsg != (char **)0x0) {
        pcVar4 = sqlite3_errmsg(in_stack_ffffffffffffffa8);
        fts5SetVtabError(p,"%s",pcVar4);
      }
    }
  }
  return local_10;
}

Assistant:

static int fts5SeekCursor(Fts5Cursor *pCsr, int bErrormsg){
  int rc = SQLITE_OK;

  /* If the cursor does not yet have a statement handle, obtain one now. */
  if( pCsr->pStmt==0 ){
    Fts5FullTable *pTab = (Fts5FullTable*)(pCsr->base.pVtab);
    int eStmt = fts5StmtType(pCsr);
    rc = sqlite3Fts5StorageStmt(
        pTab->pStorage, eStmt, &pCsr->pStmt, (bErrormsg?&pTab->p.base.zErrMsg:0)
    );
    assert( rc!=SQLITE_OK || pTab->p.base.zErrMsg==0 );
    assert( CsrFlagTest(pCsr, FTS5CSR_REQUIRE_CONTENT) );
  }

  if( rc==SQLITE_OK && CsrFlagTest(pCsr, FTS5CSR_REQUIRE_CONTENT) ){
    Fts5Table *pTab = (Fts5Table*)(pCsr->base.pVtab);
    assert( pCsr->pExpr );
    sqlite3_reset(pCsr->pStmt);
    sqlite3_bind_int64(pCsr->pStmt, 1, fts5CursorRowid(pCsr));
    pTab->pConfig->bLock++;
    rc = sqlite3_step(pCsr->pStmt);
    pTab->pConfig->bLock--;
    if( rc==SQLITE_ROW ){
      rc = SQLITE_OK;
      CsrFlagClear(pCsr, FTS5CSR_REQUIRE_CONTENT);
    }else{
      rc = sqlite3_reset(pCsr->pStmt);
      if( rc==SQLITE_OK ){
        rc = FTS5_CORRUPT;
        fts5SetVtabError((Fts5FullTable*)pTab,
            "fts5: missing row %lld from content table %s",
            fts5CursorRowid(pCsr),
            pTab->pConfig->zContent
        );
      }else if( pTab->pConfig->pzErrmsg ){
        fts5SetVtabError((Fts5FullTable*)pTab,
            "%s", sqlite3_errmsg(pTab->pConfig->db)
        );
      }
    }
  }
  return rc;
}